

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell::createTest
          (TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                                  ,0x96);
  this_00->_vptr_Utest = (_func_int **)0x0;
  *(undefined1 *)&this_00[1]._vptr_Utest = 0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_001dc608;
  return this_00;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(4000, t.dealerSelfDrawn(3, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 40));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(5, 0));

	CHECK_EQUAL(6000, t.dealerSelfDrawn(6, 0));
	CHECK_EQUAL(6000, t.dealerSelfDrawn(7, 0));

	CHECK_EQUAL(8000, t.dealerSelfDrawn(8, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(9, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(10, 0));

	CHECK_EQUAL(12000, t.dealerSelfDrawn(11, 0));
	CHECK_EQUAL(12000, t.dealerSelfDrawn(12, 0));

	CHECK_EQUAL(16000, t.dealerSelfDrawn(13, 0));
}